

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

Result * __thiscall
httplib::Client::Post
          (Result *__return_storage_ptr__,Client *this,string *path,size_t content_length,
          ContentProvider *content_provider,string *content_type)

{
  _Head_base<0UL,_httplib::ClientImpl_*,_false> this_00;
  _Manager_type p_Var1;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  
  this_00._M_head_impl =
       (this->cli_)._M_t.
       super___uniq_ptr_impl<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>_>._M_t.
       super__Tuple_impl<0UL,_httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>.
       super__Head_base<0UL,_httplib::ClientImpl_*,_false>._M_head_impl;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  local_40 = content_provider->_M_invoker;
  p_Var1 = (content_provider->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(content_provider->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(content_provider->super__Function_base)._M_functor + 8)
    ;
    (content_provider->super__Function_base)._M_manager = (_Manager_type)0x0;
    content_provider->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var1;
  }
  local_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_38._M_impl.super__Rb_tree_header._M_header;
  local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_impl._0_8_ = 0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  p_Stack_60 = local_40;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._M_object = local_78._M_unused._M_object;
    local_58._8_8_ = local_78._8_8_;
    local_68 = (_Manager_type)0x0;
    p_Stack_60 = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  local_38._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38._M_impl.super__Rb_tree_header._M_header._M_left;
  ClientImpl::Post(__return_storage_ptr__,this_00._M_head_impl,path,(Headers *)&local_38,
                   content_length,(ContentProvider *)&local_58,content_type);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_38);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result Client::Post(const std::string &path, size_t content_length,
                           ContentProvider content_provider,
                           const std::string &content_type) {
  return cli_->Post(path, content_length, std::move(content_provider),
                    content_type);
}